

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableSortSpecsColumn *pIVar2;
  ImGuiTableSortSpecsColumn *sort_spec;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTable *table_local;
  
  if ((table->IsSortSpecsDirty & 1U) == 0) {
    __assert_fail("table->IsSortSpecsDirty",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2b2a,"void ImGui::TableSortSpecsBuild(ImGuiTable *)");
  }
  TableSortSpecsSanitize(table);
  ImVector<ImGuiTableSortSpecsColumn>::resize(&table->SortSpecsData,(int)table->SortSpecsCount);
  for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
    if (pIVar1->SortOrder != -1) {
      pIVar2 = ImVector<ImGuiTableSortSpecsColumn>::operator[]
                         (&table->SortSpecsData,(int)pIVar1->SortOrder);
      *(ImGuiID *)pIVar2 = pIVar1->UserID;
      pIVar2[4] = SUB41(column._4_4_,0);
      pIVar2[5] = (ImGuiTableSortSpecsColumn)pIVar1->SortOrder;
      pIVar2[6] = (ImGuiTableSortSpecsColumn)pIVar1->SortDirection;
    }
  }
  (table->SortSpecs).Specs = (table->SortSpecsData).Data;
  (table->SortSpecs).SpecsCount = (table->SortSpecsData).Size;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}